

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.h
# Opt level: O3

void __thiscall google::protobuf::compiler::php::Generator::~Generator(Generator *this)

{
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  operator_delete(this,8);
  return;
}

Assistant:

class PROTOC_EXPORT Generator : public CodeGenerator {
 public:
  bool Generate(const FileDescriptor* file, const std::string& parameter,
                GeneratorContext* generator_context,
                std::string* error) const override;

  bool GenerateAll(const std::vector<const FileDescriptor*>& files,
                   const std::string& parameter,
                   GeneratorContext* generator_context,
                   std::string* error) const override;

  uint64_t GetSupportedFeatures() const override {
    return Feature::FEATURE_PROTO3_OPTIONAL;
  }

  Edition GetMinimumEdition() const override { return Edition::EDITION_PROTO2; }
  Edition GetMaximumEdition() const override { return Edition::EDITION_2023; }
  std::vector<const FieldDescriptor*> GetFeatureExtensions() const override {
    return {};
  }

 private:
  bool Generate(
      const FileDescriptor* file,
      const Options& options,
      GeneratorContext* generator_context,
      std::string* error) const;
}